

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::SliceStaticLayerParams::Clear(SliceStaticLayerParams *this)

{
  (this->beginids_).current_size_ = 0;
  (this->beginmasks_).current_size_ = 0;
  (this->endids_).current_size_ = 0;
  (this->endmasks_).current_size_ = 0;
  (this->strides_).current_size_ = 0;
  (this->squeezemasks_).current_size_ = 0;
  return;
}

Assistant:

void SliceStaticLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SliceStaticLayerParams)
  beginids_.Clear();
  beginmasks_.Clear();
  endids_.Clear();
  endmasks_.Clear();
  strides_.Clear();
  squeezemasks_.Clear();
}